

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_to_list(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  size_t sVar2;
  vm_val_t *this_00;
  uint *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  vm_val_t val;
  uint orig_argc;
  int idx;
  CVmObjList *lst;
  int start_idx;
  int dst_cnt;
  int src_cnt;
  CVmNativeCodeDesc *in_stack_ffffffffffffff78;
  uint *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar3;
  uint uVar4;
  int local_44;
  int local_34;
  int local_30;
  
  if (in_RCX == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *in_RCX;
  }
  uVar4 = uVar3;
  if ((getp_to_list(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_to_list(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_to_list::desc,0,2);
    __cxa_guard_release(&getp_to_list(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(uVar4,in_stack_ffffffffffffff88),in_stack_ffffffffffffff80
                     ,in_stack_ffffffffffffff78);
  if (iVar1 == 0) {
    sVar2 = get_element_count((CVmObjVector *)0x34aeb8);
    iVar1 = (int)sVar2;
    if (uVar3 == 0) {
      local_34 = 1;
    }
    else {
      local_34 = CVmBif::pop_int_val();
    }
    if (local_34 < 0) {
      local_34 = iVar1 + 1 + local_34;
    }
    if (local_34 < 1) {
      local_34 = 1;
    }
    local_34 = local_34 + -1;
    local_30 = iVar1;
    if (1 < uVar3) {
      local_30 = CVmBif::pop_int_val();
    }
    if (local_34 < iVar1) {
      if (iVar1 - local_34 < local_30) {
        local_30 = iVar1 - local_34;
      }
    }
    else {
      local_30 = 0;
    }
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,in_ESI);
    obj = CVmObjList::create((int)((ulong)in_RDX >> 0x20),(size_t)in_stack_ffffffffffffff78);
    vm_val_t::set_obj(in_RDX,obj);
    vm_objp(0);
    for (local_44 = 0; local_44 < local_30; local_44 = local_44 + 1) {
      get_element((CVmObjVector *)in_RDX,(size_t)in_stack_ffffffffffffff78,(vm_val_t *)0x34afc5);
      CVmObjList::cons_set_element
                ((CVmObjList *)in_RDX,(size_t)in_stack_ffffffffffffff78,(vm_val_t *)0x34afd9);
    }
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_to_list(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc)
{
    int src_cnt;
    int dst_cnt;
    int start_idx;
    CVmObjList *lst;
    int idx;
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(0, 2);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* note our size */
    src_cnt = get_element_count();

    /* 
     *   if there's a starting index, retrieve it; otherwise, start at our
     *   first element 
     */
    if (orig_argc >= 1)
        start_idx = (size_t)CVmBif::pop_int_val(vmg0_);
    else
        start_idx = 1;

    /* negative index values count from the end of the list */
    if (start_idx < 0)
        start_idx += src_cnt + 1;

    /* if the starting index is below 1, force it to 1 */
    if (start_idx < 1)
        start_idx = 1;

    /* adjust the starting index to a 0-based index */
    --start_idx;

    /* 
     *   if there's a size argument, retrieve it; if it's not specified,
     *   use our actual size for the output size 
     */
    if (orig_argc >= 2)
        dst_cnt = (size_t)CVmBif::pop_int_val(vmg0_);
    else
        dst_cnt = src_cnt;

    /* 
     *   in no case will the result list have more elements than we can
     *   actually supply 
     */
    if (start_idx >= src_cnt)
    {
        /* we're starting past our last element - we can't supply anything */
        dst_cnt = 0;
    }
    else if (src_cnt - start_idx < dst_cnt)
    {
        /* we can't supply as many values as requested - lower the size */
        dst_cnt = src_cnt - start_idx;
    }

    /* push a self-reference for garbage collection protection */
    G_stk->push()->set_obj(self);

    /* create the new list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, dst_cnt));
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* set the list elements */
    for (idx = 0 ; idx < dst_cnt ; ++idx)
    {
        vm_val_t val;

        /* get my element at this index */
        get_element(idx + start_idx, &val);

        /* store the element in the list */
        lst->cons_set_element(idx, &val);
    }

    /* discard the self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}